

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O1

int fy_atom_cmp(fy_atom *atom1,fy_atom *atom2)

{
  fy_input *pfVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  ulong __n;
  void *pvVar8;
  ulong len;
  ulong len_00;
  fy_atom_iter iter2;
  fy_atom_iter iter1;
  fy_atom_iter local_3f0;
  fy_atom_iter local_208;
  
  if (atom1 == atom2) {
    return 1;
  }
  if (atom2 == (fy_atom *)0x0 || atom1 == (fy_atom *)0x0) goto LAB_001417f5;
  len = 0;
  pvVar6 = (void *)0x0;
  if ((atom1->field_0x35 & 4) == 0) goto LAB_00141671;
  pfVar1 = atom1->fyi;
  lVar7 = 0x48;
  switch((pfVar1->cfg).type) {
  case fyit_file:
    pvVar6 = (pfVar1->field_11).file.addr;
    if (pvVar6 == (void *)0x0) goto switchD_00141634_caseD_1;
    break;
  case fyit_memory:
  case fyit_alloc:
    lVar7 = 0x28;
  case fyit_stream:
switchD_00141634_caseD_1:
    pvVar6 = *(void **)((long)&(pfVar1->node).next + lVar7);
    break;
  default:
    pvVar6 = (void *)0x0;
  }
  if (pvVar6 == (void *)0x0) goto LAB_00141805;
  sVar2 = (atom1->start_mark).input_pos;
  pvVar6 = (void *)((long)pvVar6 + sVar2);
  len = (atom1->end_mark).input_pos - sVar2;
LAB_00141671:
  len_00 = 0;
  pvVar8 = (void *)0x0;
  if ((atom2->field_0x35 & 4) != 0) {
    pfVar1 = atom2->fyi;
    lVar7 = 0x48;
    switch((pfVar1->cfg).type) {
    case fyit_file:
      pvVar8 = (pfVar1->field_11).file.addr;
      if (pvVar8 == (void *)0x0) goto switchD_0014169f_caseD_1;
      break;
    case fyit_memory:
    case fyit_alloc:
      lVar7 = 0x28;
    case fyit_stream:
switchD_0014169f_caseD_1:
      pvVar8 = *(void **)((long)&(pfVar1->node).next + lVar7);
      break;
    default:
      pvVar8 = (void *)0x0;
    }
    if (pvVar8 == (void *)0x0) {
LAB_00141805:
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.h"
                    ,0x9a,"const void *fy_input_start(const struct fy_input *)");
    }
    sVar2 = (atom2->start_mark).input_pos;
    pvVar8 = (void *)((long)pvVar8 + sVar2);
    len_00 = (atom2->end_mark).input_pos - sVar2;
  }
  if ((pvVar6 == (void *)0x0) || (pvVar8 == (void *)0x0)) {
    if (pvVar8 != (void *)0x0) {
      iVar4 = fy_atom_memcmp(atom1,pvVar8,len_00);
      return iVar4;
    }
    if (pvVar6 == (void *)0x0) {
      fy_atom_iter_start(atom1,&local_208);
      fy_atom_iter_start(atom2,&local_3f0);
      do {
        uVar3 = fy_atom_iter_getc(&local_208);
        uVar5 = fy_atom_iter_getc(&local_3f0);
        if (uVar3 != uVar5) break;
      } while (-1 < (int)(uVar5 | uVar3));
      if (local_3f0.chunks != local_3f0.startup_chunks &&
          local_3f0.chunks != (fy_atom_iter_chunk *)0x0) {
        free(local_3f0.chunks);
      }
      local_3f0.chunks = (fy_atom_iter_chunk *)0x0;
      if (local_208.chunks != local_208.startup_chunks &&
          local_208.chunks != (fy_atom_iter_chunk *)0x0) {
        free(local_208.chunks);
      }
      if ((uVar5 & uVar3) == 0xffffffff) {
LAB_001417f5:
        uVar3 = 0;
      }
      else {
        uVar3 = (uint)((int)uVar5 <= (int)uVar3) * 2 - 1;
      }
    }
    else {
      iVar4 = fy_atom_memcmp(atom2,pvVar6,len);
      uVar3 = -iVar4;
    }
  }
  else {
    __n = len_00;
    if (len < len_00) {
      __n = len;
    }
    uVar3 = memcmp(pvVar6,pvVar8,__n);
    if ((uVar3 == 0) && (uVar3 = -(uint)(len < len_00) | 1, len == len_00)) {
      uVar3 = 0;
    }
  }
  return uVar3;
}

Assistant:

int fy_atom_cmp(struct fy_atom *atom1, struct fy_atom *atom2) {
    struct fy_atom_iter iter1, iter2;
    const char *d1, *d2;
    size_t l1, l2, l;
    int c1, c2, ret;

    /* handles NULL case too */
    if (atom1 == atom2)
        return true;

    /* either null, can't do */
    if (!atom1 || !atom2)
        return false;

    /* direct output? */
    if (atom1->direct_output) {
        d1 = fy_atom_data(atom1);
        l1 = fy_atom_size(atom1);
    } else {
        d1 = NULL;
        l1 = 0;
    }
    if (atom2->direct_output) {
        d2 = fy_atom_data(atom2);
        l2 = fy_atom_size(atom2);
    } else {
        d2 = NULL;
        l2 = 0;
    }

    /* we have both atoms with direct output */
    if (d1 && d2) {
        l = l1 > l2 ? l2 : l1;
        ret = memcmp(d1, d2, l);
        if (ret)
            return ret;
        return l1 == l2 ? 0 : l2 > l1 ? -1 : 1;
    }

    /* only atom2 is direct */
    if (d2)
        return fy_atom_memcmp(atom1, d2, l2);

    /* only atom1 is direct, (note reversing sign) */
    if (d1)
        return -fy_atom_memcmp(atom2, d1, l1);

    /* neither is direct, do it with iterators */
    fy_atom_iter_start(atom1, &iter1);
    fy_atom_iter_start(atom2, &iter2);
    do {
        c1 = fy_atom_iter_getc(&iter1);
        c2 = fy_atom_iter_getc(&iter2);
    } while (c1 == c2 && c1 >= 0 && c2 >= 0);
    fy_atom_iter_finish(&iter2);
    fy_atom_iter_finish(&iter1);

    if (c1 == -1 && c2 == -1)
        return 0;

    return c2 > c1 ? -1 : 1;
}